

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::cleanupAnswerTable
          (RpcCallContext *this,Array<unsigned_int> *resultExports,bool shouldFreePipeline)

{
  size_t *psVar1;
  RpcConnectionState *this_00;
  undefined8 this_01;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault local_a0;
  undefined1 local_98 [24];
  anon_union_16_1_a8a2e026_for_OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>_2
  local_80;
  Answer local_70;
  
  if (this->receivedFinish == true) {
    local_98._0_8_ = resultExports->size_;
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    local_98._16_8_ = " == ";
    local_80._0_8_ = 5;
    local_80.space[8] = (Exception *)local_98._0_8_ == (Exception *)0x0;
    if (!(bool)local_80.space[8]) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xd51,FAILED,"resultExports.size() == 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)local_98);
      kj::_::Debug::Fault::fatal(&local_a0);
    }
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::erase(&local_70,&((this->connectionState).ptr)->answers,this->answerId);
    Answer::~Answer(&local_70);
  }
  else {
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
           local_98,(int)(this->connectionState).ptr + 0x2d8);
    this_01 = local_98._0_8_;
    if ((Exception *)local_98._0_8_ == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xd55,FAILED,"connectionState->answers.find(answerId) != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)local_98);
    }
    (((String *)(local_98._0_8_ + 0x28))->content).ptr = (char *)0x0;
    kj::Array<unsigned_int>::operator=
              ((Array<unsigned_int> *)&(((String *)(local_98._0_8_ + 0x28))->content).size_,
               resultExports);
    if (shouldFreePipeline) {
      local_98._0_8_ = resultExports->size_;
      local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
      local_98._16_8_ = " == ";
      local_80._0_8_ = 5;
      local_80.space[8] = (Exception *)local_98._0_8_ == (Exception *)0x0;
      if (!(bool)local_80.space[8]) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                  (&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xd5c,FAILED,"resultExports.size() == 0","_kjCondition,",
                   (DebugComparison<unsigned_long,_int> *)local_98);
        kj::_::Debug::Fault::fatal(&local_a0);
      }
      local_98._0_8_ = (Exception *)0x0;
      local_98._8_8_ = (PipelineHook *)0x0;
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator=
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)this_01,
                 (Own<capnp::PipelineHook,_std::nullptr_t> *)local_98);
      kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose
                ((Own<capnp::PipelineHook,_std::nullptr_t> *)local_98);
    }
  }
  this_00 = (this->connectionState).ptr;
  psVar1 = &this_00->callWordsInFlight;
  *psVar1 = *psVar1 - this->requestSize;
  maybeUnblockFlow(this_00);
  if (this->receivedFinish == true) {
    checkIfBecameIdle((this->connectionState).ptr);
  }
  return;
}

Assistant:

void cleanupAnswerTable(kj::Array<ExportId> resultExports, bool shouldFreePipeline) {
      // We need to remove the `callContext` pointer -- which points back to us -- from the
      // answer table.  Or we might even be responsible for removing the entire answer table
      // entry.

      if (receivedFinish) {
        // Already received `Finish` so it's our job to erase the table entry. We shouldn't have
        // sent results if canceled, so we shouldn't have an export list to deal with.
        KJ_ASSERT(resultExports.size() == 0);
        connectionState->answers.erase(answerId);
      } else {
        // We just have to null out callContext and set the exports.
        auto& answer = KJ_ASSERT_NONNULL(connectionState->answers.find(answerId));
        answer.callContext = kj::none;
        answer.resultExports = kj::mv(resultExports);

        if (shouldFreePipeline) {
          // We can free the pipeline early, because we know all pipeline calls are invalid (e.g.
          // because there are no caps in the result to receive pipeline requests).
          KJ_ASSERT(resultExports.size() == 0);
          answer.pipeline = kj::none;
        }
      }

      // Also, this is the right time to stop counting the call against the flow limit.
      connectionState->callWordsInFlight -= requestSize;
      connectionState->maybeUnblockFlow();

      // If we erased the answer table entry above, check for idleness now.
      if (receivedFinish) {
        connectionState->checkIfBecameIdle();
      }
    }